

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Instruction * __thiscall spv::Builder::addInstruction(Builder *this,Op op)

{
  pointer pIVar1;
  Block *this_00;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_40 [3];
  pointer local_28;
  Instruction *ret;
  __single_object inst;
  Op op_local;
  Builder *this_local;
  
  inst._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ = op;
  std::make_unique<spv::Instruction,spv::Op&>((Op *)&ret);
  local_28 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::get
                       ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&ret
                       );
  this_00 = getBuildPoint(this);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
            (local_40,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&ret);
  Block::addInstruction(this_00,local_40);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(local_40);
  pIVar1 = local_28;
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
            ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&ret);
  return pIVar1;
}

Assistant:

spv::Instruction *Builder::addInstruction(spv::Op op)
{
    auto inst = std::make_unique<spv::Instruction>(op);
    auto *ret = inst.get();
    getBuildPoint()->addInstruction(std::move(inst));
    return ret;
}